

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphcycles.cc
# Opt level: O1

bool __thiscall
absl::lts_20250127::synchronization_internal::anon_unknown_0::NodeSet::insert
          (NodeSet *this,int32_t v)

{
  int iVar1;
  uint uVar2;
  int *piVar3;
  int *piVar4;
  uint32_t uVar5;
  ulong uVar6;
  long lVar7;
  Vec<int> copy;
  Vec<int> local_60;
  
  uVar5 = FindIndex(this,v);
  piVar3 = (this->table_).ptr_;
  iVar1 = piVar3[uVar5];
  if (iVar1 != v) {
    if (iVar1 == -1) {
      this->occupied_ = this->occupied_ + 1;
    }
    piVar3[uVar5] = v;
    uVar2 = (this->table_).size_;
    if (uVar2 - (uVar2 >> 2) <= this->occupied_) {
      local_60.ptr_ = local_60.space_;
      local_60.size_ = 0;
      local_60.capacity_ = 8;
      piVar4 = (this->table_).space_;
      if (piVar3 == piVar4) {
        if (8 < uVar2) {
          Vec<int>::Grow(&local_60,uVar2);
        }
        local_60.size_ = uVar2;
        uVar6 = (ulong)(this->table_).size_;
        if (uVar6 != 0) {
          memmove(local_60.ptr_,(this->table_).ptr_,uVar6 << 2);
        }
        (this->table_).size_ = 0;
      }
      else {
        local_60.ptr_ = (this->table_).ptr_;
        local_60.size_ = (this->table_).size_;
        local_60.capacity_ = (this->table_).capacity_;
        (this->table_).ptr_ = piVar4;
        (this->table_).size_ = 0;
        (this->table_).capacity_ = 8;
      }
      this->occupied_ = 0;
      uVar2 = local_60.size_ * 2;
      if ((this->table_).capacity_ < uVar2) {
        Vec<int>::Grow(&this->table_,uVar2);
      }
      piVar3 = local_60.ptr_;
      (this->table_).size_ = uVar2;
      if (uVar2 != 0) {
        piVar4 = (this->table_).ptr_;
        uVar6 = 0;
        do {
          piVar4[uVar6] = -1;
          uVar6 = uVar6 + 1;
        } while (uVar6 < (this->table_).size_);
      }
      uVar6 = local_60._40_8_ & 0xffffffff;
      if (uVar6 != 0) {
        lVar7 = 0;
        do {
          if (-1 < *(int32_t *)((long)piVar3 + lVar7)) {
            insert(this,*(int32_t *)((long)piVar3 + lVar7));
          }
          lVar7 = lVar7 + 4;
        } while (uVar6 << 2 != lVar7);
      }
      Vec<int>::~Vec(&local_60);
    }
  }
  return iVar1 != v;
}

Assistant:

bool insert(int32_t v) {
    uint32_t i = FindIndex(v);
    if (table_[i] == v) {
      return false;
    }
    if (table_[i] == kEmpty) {
      // Only inserting over an empty cell increases the number of occupied
      // slots.
      occupied_++;
    }
    table_[i] = v;
    // Double when 75% full.
    if (occupied_ >= table_.size() - table_.size()/4) Grow();
    return true;
  }